

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlslangToSpv.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_12b4667::TGlslangToSpvTraverser::applySpirvDecorate
          (TGlslangToSpvTraverser *this,TType *type,Id id,optional<int> member)

{
  Builder *this_00;
  long lVar1;
  TIntermTyped *node;
  _Base_ptr p_Var2;
  int iVar3;
  Id IVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _Rb_tree_node_base *p_Var5;
  undefined8 extraout_RDX;
  const_iterator __begin3;
  _Base_ptr p_Var6;
  TMap<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>_> *__range1;
  const_iterator __begin2;
  _Rb_tree_node_base *p_Var7;
  undefined1 auVar8 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> literals;
  char *string;
  TVector<const_glslang::TIntermConstantUnion_*> local_78;
  char *local_58;
  _Optional_payload_base<int> local_50;
  ulong local_48;
  long local_40;
  Builder *local_38;
  
  local_50 = (_Optional_payload_base<int>)
             member.super__Optional_base<int,_true,_true>._M_payload.
             super__Optional_payload_base<int>;
  iVar3 = (*type->_vptr_TType[0xb])(type);
  if (*(long *)(CONCAT44(extraout_var,iVar3) + 0x40) == 0) {
    __assert_fail("type.getQualifier().hasSpirvDecorate()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                  ,0x14b8,
                  "void (anonymous namespace)::TGlslangToSpvTraverser::applySpirvDecorate(const glslang::TType &, spv::Id, std::optional<int>)"
                 );
  }
  iVar3 = (*type->_vptr_TType[0xb])(type);
  lVar1 = *(long *)(CONCAT44(extraout_var_00,iVar3) + 0x40);
  if (lVar1 != 0) {
    local_48 = (ulong)local_50 >> 0x20;
    auVar8._8_8_ = extraout_RDX;
    auVar8._0_8_ = *(long *)(lVar1 + 0x20);
    if (*(long *)(lVar1 + 0x20) != lVar1 + 0x10) {
      this_00 = &this->builder;
      do {
        p_Var5 = auVar8._0_8_;
        if (p_Var5[1]._M_left == p_Var5[1]._M_right) {
          if ((local_48 & 1) == 0) {
            spv::Builder::addDecoration(this_00,id,p_Var5[1]._M_color,-1);
          }
          else {
            spv::Builder::addMemberDecoration
                      (this_00,id,local_50._M_payload._M_value,p_Var5[1]._M_color,-1);
          }
        }
        else {
          local_78.
          super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          .
          super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
          local_78.
          super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          .
          super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_78.
          super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          .
          super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          TranslateLiterals((TGlslangToSpvTraverser *)&p_Var5[1]._M_parent,&local_78,auVar8._8_8_);
          if ((local_48 & 1) == 0) {
            spv::Builder::addDecoration
                      (this_00,id,p_Var5[1]._M_color,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78);
          }
          else {
            spv::Builder::addMemberDecoration
                      (this_00,id,local_50._M_payload._M_value,p_Var5[1]._M_color,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78);
          }
          if (local_78.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Tp_alloc_type.allocator != (TPoolAllocator *)0x0) {
            operator_delete(local_78.
                            super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                            .
                            super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                            ._M_impl.super__Tp_alloc_type.allocator,
                            (long)local_78.
                                  super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                  .
                                  super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_78.
                                  super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                  .
                                  super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                  ._M_impl.super__Tp_alloc_type.allocator);
          }
        }
        auVar8 = std::_Rb_tree_increment(p_Var5);
      } while (auVar8._0_8_ != lVar1 + 0x10);
    }
    local_40 = lVar1;
    if ((local_48 & 1) == 0) {
      p_Var5 = *(_Rb_tree_node_base **)(lVar1 + 0x58);
      local_78.
      super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
      .
      super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(lVar1 + 0x48);
      if (p_Var5 != (_Rb_tree_node_base *)
                    local_78.
                    super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                    .
                    super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_38 = &this->builder;
        do {
          local_78.
          super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          .
          super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
          local_78.
          super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          .
          super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_78.
          super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          .
          super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          p_Var6 = p_Var5[1]._M_left;
          p_Var2 = p_Var5[1]._M_right;
          if (p_Var6 == p_Var2) {
            __assert_fail("!decorateId.second.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                          ,0x14d4,
                          "void (anonymous namespace)::TGlslangToSpvTraverser::applySpirvDecorate(const glslang::TType &, spv::Id, std::optional<int>)"
                         );
          }
          do {
            node = *(TIntermTyped **)p_Var6;
            iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x22])(node);
            if ((*(ulong *)(CONCAT44(extraout_var_01,iVar3) + 8) & 0x10000007f) == 2) {
              IVar4 = createSpvConstant(this,node);
            }
            else {
              iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x18])(node);
              IVar4 = getSymbolId(this,(TIntermSymbol *)CONCAT44(extraout_var_02,iVar3));
            }
            local_58 = (char *)CONCAT44(local_58._4_4_,IVar4);
            if (local_78.
                super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                .
                super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                local_78.
                super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                .
                super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,
                         (iterator)
                         local_78.
                         super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                         .
                         super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,(uint *)&local_58);
            }
            else {
              *(Id *)local_78.
                     super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                     .
                     super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                     ._M_impl.super__Vector_impl_data._M_start = IVar4;
              local_78.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)((long)local_78.
                                   super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                   .
                                   super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 4);
            }
            p_Var6 = (_Base_ptr)&p_Var6->_M_parent;
          } while (p_Var6 != p_Var2);
          spv::Builder::addDecorationId
                    (local_38,id,p_Var5[1]._M_color,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78);
          if (local_78.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Tp_alloc_type.allocator != (TPoolAllocator *)0x0) {
            operator_delete(local_78.
                            super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                            .
                            super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                            ._M_impl.super__Tp_alloc_type.allocator,
                            (long)local_78.
                                  super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                  .
                                  super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_78.
                                  super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                  .
                                  super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                  ._M_impl.super__Tp_alloc_type.allocator);
          }
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
        } while (p_Var5 != (_Rb_tree_node_base *)
                           local_78.
                           super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                           .
                           super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
    else if (*(long *)(lVar1 + 0x68) != 0) {
      __assert_fail("spirvDecorate.decorateIds.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                    ,0x14d0,
                    "void (anonymous namespace)::TGlslangToSpvTraverser::applySpirvDecorate(const glslang::TType &, spv::Id, std::optional<int>)"
                   );
    }
    p_Var5 = *(_Rb_tree_node_base **)(local_40 + 0x90);
    p_Var7 = (_Rb_tree_node_base *)(local_40 + 0x80);
    if (p_Var5 != p_Var7) {
      local_78.
      super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
      .
      super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&this->builder;
      do {
        local_78.
        super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
        .
        super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
        ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
        local_78.
        super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
        .
        super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.
        super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
        .
        super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        p_Var6 = p_Var5[1]._M_left;
        p_Var2 = p_Var5[1]._M_right;
        if (p_Var6 == p_Var2) {
          __assert_fail("!decorateString.second.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/GlslangToSpv.cpp"
                        ,0x14e2,
                        "void (anonymous namespace)::TGlslangToSpvTraverser::applySpirvDecorate(const glslang::TType &, spv::Id, std::optional<int>)"
                       );
        }
        do {
          local_58 = *(char **)(**(long **)(*(long *)(*(long *)p_Var6 + 0xc0) + 8) + 8);
          if (local_78.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_78.
              super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              .
              super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            std::vector<char_const*,std::allocator<char_const*>>::
            _M_realloc_insert<char_const*const&>
                      ((vector<char_const*,std::allocator<char_const*>> *)&local_78,
                       (iterator)
                       local_78.
                       super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                       .
                       super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,&local_58);
          }
          else {
            *local_78.
             super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
             .
             super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
             ._M_impl.super__Vector_impl_data._M_start = (TIntermConstantUnion *)local_58;
            local_78.
            super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            .
            super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_78.
                 super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                 .
                 super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
          }
          p_Var6 = (_Base_ptr)&p_Var6->_M_parent;
        } while (p_Var6 != p_Var2);
        if ((local_48 & 1) == 0) {
          spv::Builder::addDecoration
                    ((Builder *)
                     local_78.
                     super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                     .
                     super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,id,p_Var5[1]._M_color,
                     (vector<const_char_*,_std::allocator<const_char_*>_> *)&local_78);
        }
        else {
          spv::Builder::addMemberDecoration
                    ((Builder *)
                     local_78.
                     super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                     .
                     super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,id,
                     local_50._M_payload._M_value,p_Var5[1]._M_color,
                     (vector<const_char_*,_std::allocator<const_char_*>_> *)&local_78);
        }
        if (local_78.
            super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            .
            super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
            ._M_impl.super__Tp_alloc_type.allocator != (TPoolAllocator *)0x0) {
          operator_delete(local_78.
                          super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                          .
                          super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                          ._M_impl.super__Tp_alloc_type.allocator,
                          (long)local_78.
                                super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                .
                                super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_78.
                                super_vector<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                .
                                super__Vector_base<const_glslang::TIntermConstantUnion_*,_glslang::pool_allocator<const_glslang::TIntermConstantUnion_*>_>
                                ._M_impl.super__Tp_alloc_type.allocator);
        }
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      } while (p_Var5 != p_Var7);
    }
    return;
  }
  __assert_fail("spirvDecorate",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                ,0x435,"const TSpirvDecorate &glslang::TQualifier::getSpirvDecorate() const");
}

Assistant:

void TGlslangToSpvTraverser::applySpirvDecorate(const glslang::TType& type, spv::Id id, std::optional<int> member)
{
    assert(type.getQualifier().hasSpirvDecorate());

    const glslang::TSpirvDecorate& spirvDecorate = type.getQualifier().getSpirvDecorate();

    // Add spirv_decorate
    for (auto& decorate : spirvDecorate.decorates) {
        if (!decorate.second.empty()) {
            std::vector<unsigned> literals;
            TranslateLiterals(decorate.second, literals);
            if (member.has_value())
                builder.addMemberDecoration(id, *member, static_cast<spv::Decoration>(decorate.first), literals);
            else
                builder.addDecoration(id, static_cast<spv::Decoration>(decorate.first), literals);
        } else {
            if (member.has_value())
                builder.addMemberDecoration(id, *member, static_cast<spv::Decoration>(decorate.first));
            else
                builder.addDecoration(id, static_cast<spv::Decoration>(decorate.first));
        }
    }

    // Add spirv_decorate_id
    if (member.has_value()) {
        // spirv_decorate_id not applied to members
        assert(spirvDecorate.decorateIds.empty());
    } else {
        for (auto& decorateId : spirvDecorate.decorateIds) {
            std::vector<spv::Id> operandIds;
            assert(!decorateId.second.empty());
            for (auto extraOperand : decorateId.second) {
                if (extraOperand->getQualifier().isFrontEndConstant())
                    operandIds.push_back(createSpvConstant(*extraOperand));
                else
                    operandIds.push_back(getSymbolId(extraOperand->getAsSymbolNode()));
            }
            builder.addDecorationId(id, static_cast<spv::Decoration>(decorateId.first), operandIds);
        }
    }

    // Add spirv_decorate_string
    for (auto& decorateString : spirvDecorate.decorateStrings) {
        std::vector<const char*> strings;
        assert(!decorateString.second.empty());
        for (auto extraOperand : decorateString.second) {
            const char* string = extraOperand->getConstArray()[0].getSConst()->c_str();
            strings.push_back(string);
        }
        if (member.has_value())
            builder.addMemberDecoration(id, *member, static_cast<spv::Decoration>(decorateString.first), strings);
        else
            builder.addDecoration(id, static_cast<spv::Decoration>(decorateString.first), strings);
    }
}